

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactTriangleXYZROT::ContactForceLoadResidual_F
          (ChContactTriangleXYZROT *this,ChVector<double> *F,ChVector<double> *abs_point,
          ChVectorDynamic<> *R)

{
  element_type *peVar1;
  double dVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  bool is_into;
  double s3;
  double s2;
  ChVector<double> local_48;
  ChVector<double> local_30;
  
  local_30.m_data[0] = abs_point->m_data[0];
  local_30.m_data[1] = abs_point->m_data[1];
  local_30.m_data[2] = abs_point->m_data[2];
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  collision::utils::PointTriangleDistance
            (&local_30,
             (ChVector<double> *)
             &(((this->mnode1).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode2).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode3).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,&s2,&s3,&is_into,&local_48);
  peVar1 = (this->mnode1).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = (ulong)*(uint *)((long)&(peVar1->super_ChNodeFEAbase).m_TotalMass +
                          (long)((peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + 4));
  if ((long)uVar4 <=
      (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3) {
    pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             uVar4;
    uVar4 = 3;
    if ((((ulong)pdVar3 & 7) == 0) &&
       (uVar5 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
      uVar4 = uVar5;
    }
    dVar2 = (1.0 - s2) - s3;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        pdVar3[uVar5] = dVar2 * F->m_data[uVar5] + pdVar3[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    if (uVar4 < 3) {
      do {
        pdVar3[uVar4] = dVar2 * F->m_data[uVar4] + pdVar3[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 != 3);
    }
    peVar1 = (this->mnode2).
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar4 = (ulong)*(uint *)((long)&(peVar1->super_ChNodeFEAbase).m_TotalMass +
                            (long)((peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + 4));
    if ((long)uVar4 <=
        (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3) {
      pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + uVar4;
      uVar4 = 3;
      if ((((ulong)pdVar3 & 7) == 0) &&
         (uVar5 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
        uVar4 = uVar5;
      }
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          pdVar3[uVar5] = s2 * F->m_data[uVar5] + pdVar3[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      if (uVar4 < 3) {
        do {
          pdVar3[uVar4] = s2 * F->m_data[uVar4] + pdVar3[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      peVar1 = (this->mnode3).
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar4 = (ulong)*(uint *)((long)&(peVar1->super_ChNodeFEAbase).m_TotalMass +
                              (long)((peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + 4));
      if ((long)uVar4 <=
          (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3)
      {
        pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + uVar4;
        uVar4 = 3;
        if ((((ulong)pdVar3 & 7) == 0) &&
           (uVar5 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
          uVar4 = uVar5;
        }
        if (uVar4 != 0) {
          uVar5 = 0;
          do {
            pdVar3[uVar5] = s3 * F->m_data[uVar5] + pdVar3[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        if (uVar4 < 3) {
          do {
            pdVar3[uVar4] = s3 * F->m_data[uVar4] + pdVar3[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar4 != 3);
        }
        return;
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChContactTriangleXYZROT::ContactForceLoadResidual_F(const ChVector<>& F,
                                                         const ChVector<>& abs_point,
                                                         ChVectorDynamic<>& R) {
    double s2, s3;
    ComputeUVfromP(abs_point, s2, s3);
    double s1 = 1 - s2 - s3;
    R.segment(mnode1->NodeGetOffset_w(), 3) += F.eigen() * s1;
    R.segment(mnode2->NodeGetOffset_w(), 3) += F.eigen() * s2;
    R.segment(mnode3->NodeGetOffset_w(), 3) += F.eigen() * s3;
}